

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O1

void av1_filter_block_plane_vert_opt
               (AV1_COMMON *cm,MACROBLOCKD *xd,MACROBLOCKD_PLANE *plane_ptr,uint32_t mi_row,
               uint32_t mi_col,AV1_DEBLOCKING_PARAMETERS *params_buf,TX_SIZE *tx_buf,
               int num_mis_in_lpf_unit_height_log2)

{
  BLOCK_SIZE BVar1;
  int dst_stride;
  uint8_t *puVar2;
  MB_MODE_INFO **ppMVar3;
  MB_MODE_INFO *pMVar4;
  MB_MODE_INFO *pMVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  loop_filter_info_n *lfi_n;
  bool bVar11;
  uint uVar12;
  uint8_t *dst;
  byte bVar13;
  uint uVar14;
  byte *pbVar15;
  int iVar16;
  int iVar17;
  byte bVar18;
  int iVar19;
  AV1_DEBLOCKING_PARAMETERS *pAVar20;
  USE_FILTER_TYPE use_filter_type;
  
  iVar8 = ((plane_ptr->dst).height + 3 >> 2) - mi_row;
  iVar16 = 1 << ((byte)num_mis_in_lpf_unit_height_log2 & 0x1f);
  if (iVar8 < iVar16) {
    iVar16 = iVar8;
  }
  iVar17 = ((plane_ptr->dst).width + 3 >> 2) - mi_col;
  iVar8 = 0x20;
  if (iVar17 < 0x20) {
    iVar8 = iVar17;
  }
  if (0 < iVar16) {
    puVar2 = (plane_ptr->dst).buf;
    dst_stride = (plane_ptr->dst).stride;
    lfi_n = &cm->lf_info;
    uVar14 = 0;
    do {
      uVar12 = uVar14 + mi_row;
      params_buf->filter_length = '\0';
      uVar9 = (cm->mi_params).mi_stride * uVar12;
      ppMVar3 = (cm->mi_params).mi_grid_base;
      pMVar4 = ppMVar3[(ulong)uVar9 + (ulong)mi_col];
      if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar4->field_0xa7 & 7] == 0)) {
        bVar18 = pMVar4->tx_size;
        if ((((pMVar4->field_0xa7 & 0x80) != 0) || ('\0' < pMVar4->ref_frame[0])) &&
           (pMVar4->skip_txfm == '\0')) {
          BVar1 = pMVar4->bsize;
          bVar18 = pMVar4->inter_tx_size
                   [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                           [BVar1] - 1 & mi_col) >>
                    (av1_get_txb_size_index_tw_w_log2_table[BVar1] & 0x1f)) +
                    (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                            [BVar1] - 1 & uVar12) >>
                     (av1_get_txb_size_index_tw_h_log2_table[BVar1] & 0x1f)) <<
                    (av1_get_txb_size_index_stride_log2_table[BVar1] & 0x1f))];
        }
      }
      else {
        bVar18 = 0;
      }
      if (mi_col == 0) {
        bVar13 = 0x80;
      }
      else {
        pMVar5 = ppMVar3[(ulong)uVar9 + ((ulong)mi_col - 1)];
        if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar5->field_0xa7 & 7] == 0)) {
          bVar7 = pMVar5->tx_size;
          if ((((pMVar5->field_0xa7 & 0x80) != 0) || ('\0' < pMVar5->ref_frame[0])) &&
             (pMVar5->skip_txfm == '\0')) {
            BVar1 = pMVar5->bsize;
            bVar7 = pMVar5->inter_tx_size
                    [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                            [BVar1] - 1 & mi_col - 1) >>
                     (av1_get_txb_size_index_tw_w_log2_table[BVar1] & 0x1f)) +
                     (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                             [BVar1] - 1 & uVar12) >>
                      (av1_get_txb_size_index_tw_h_log2_table[BVar1] & 0x1f)) <<
                     (av1_get_txb_size_index_stride_log2_table[BVar1] & 0x1f))];
          }
        }
        else {
          bVar7 = 0;
        }
        bVar13 = block_size_high[pMVar5->bsize];
        bVar6 = get_filter_level(cm,lfi_n,0,0,pMVar4);
        if (bVar6 == 0) {
          bVar6 = get_filter_level(cm,lfi_n,0,0,pMVar5);
        }
        bVar11 = true;
        if ((pMVar5 == pMVar4) && (pMVar4->skip_txfm != '\0')) {
          if ((pMVar4->field_0xa7 & 0x80) == 0) {
            bVar11 = pMVar4->ref_frame[0] < '\x01';
          }
          else {
            bVar11 = false;
          }
        }
        if (pMVar5 == pMVar4) {
          if ((bool)(bVar11 & bVar6 != 0)) goto LAB_00385cee;
        }
        else if (bVar6 != 0) {
LAB_00385cee:
          params_buf->filter_length = (uint8_t)vert_filter_length_luma[bVar18][bVar7];
          params_buf->lfthr = (loop_filter_thresh *)(lfi_n->lfthr[0].mblim + (uint)bVar6 * 0x30);
        }
      }
      bVar7 = block_size_high[pMVar4->bsize];
      if (bVar13 < block_size_high[pMVar4->bsize]) {
        bVar7 = bVar13;
      }
      *tx_buf = bVar18;
      iVar19 = tx_size_wide_unit[bVar18];
      uVar9 = mi_col + iVar19;
      if (uVar9 < iVar8 + mi_col) {
        pbVar15 = tx_buf + iVar19;
        pAVar20 = params_buf + iVar19;
        do {
          pAVar20->filter_length = '\0';
          uVar10 = (cm->mi_params).mi_stride * uVar12;
          ppMVar3 = (cm->mi_params).mi_grid_base;
          pMVar4 = ppMVar3[(ulong)uVar10 + (ulong)uVar9];
          if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&pMVar4->field_0xa7 & 7] == 0))
          {
            bVar13 = pMVar4->tx_size;
            if ((((pMVar4->field_0xa7 & 0x80) != 0) || ('\0' < pMVar4->ref_frame[0])) &&
               (pMVar4->skip_txfm == '\0')) {
              BVar1 = pMVar4->bsize;
              bVar13 = pMVar4->inter_tx_size
                       [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                               [BVar1] - 1 & uVar9) >>
                        (av1_get_txb_size_index_tw_w_log2_table[BVar1] & 0x1f)) +
                        (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                [BVar1] - 1 & uVar12) >>
                         (av1_get_txb_size_index_tw_h_log2_table[BVar1] & 0x1f)) <<
                        (av1_get_txb_size_index_stride_log2_table[BVar1] & 0x1f))];
            }
          }
          else {
            bVar13 = 0;
          }
          pMVar5 = ppMVar3[(ulong)uVar10 + ((ulong)uVar9 - 1)];
          bVar6 = get_filter_level(cm,lfi_n,0,0,pMVar4);
          if (bVar6 == 0) {
            bVar6 = get_filter_level(cm,lfi_n,0,0,pMVar5);
          }
          bVar11 = true;
          if ((pMVar5 == pMVar4) && (pMVar4->skip_txfm != '\0')) {
            if ((pMVar4->field_0xa7 & 0x80) == 0) {
              bVar11 = pMVar4->ref_frame[0] < '\x01';
            }
            else {
              bVar11 = false;
            }
          }
          if (pMVar5 == pMVar4) {
            if ((bool)(bVar11 & bVar6 != 0)) goto LAB_00385e8e;
          }
          else if (bVar6 != 0) {
LAB_00385e8e:
            pAVar20->filter_length = (uint8_t)vert_filter_length_luma[bVar13][bVar18];
            pAVar20->lfthr = (loop_filter_thresh *)(lfi_n->lfthr[0].mblim + (uint)bVar6 * 0x30);
          }
          if (block_size_high[pMVar4->bsize] <= bVar7) {
            bVar7 = block_size_high[pMVar4->bsize];
          }
          *pbVar15 = bVar13;
          iVar19 = tx_size_wide_unit[bVar13];
          uVar9 = uVar9 + iVar19;
          pbVar15 = pbVar15 + iVar19;
          pAVar20 = pAVar20 + iVar19;
          bVar18 = bVar13;
        } while (uVar9 < iVar8 + mi_col);
      }
      if ((((uVar14 & 3) != 0) || (uVar9 = uVar14 | 3, iVar16 <= (int)uVar9)) ||
         (use_filter_type = '\x02', bVar7 < 0x10)) {
        uVar9 = uVar14 + 1;
        use_filter_type = 7 < bVar7 && (int)uVar9 < iVar16;
        if (7 >= bVar7 || (int)uVar9 >= iVar16) {
          uVar9 = uVar14;
        }
      }
      if (0 < iVar17) {
        dst = puVar2 + (int)(uVar14 * dst_stride * 4);
        iVar19 = 0;
        pbVar15 = tx_buf;
        pAVar20 = params_buf;
        do {
          if (*pbVar15 == 0xff) {
            pAVar20->filter_length = '\0';
            *pbVar15 = 0;
          }
          filter_vert(dst,dst_stride,pAVar20,cm->seq_params,use_filter_type);
          uVar14 = tx_size_wide_unit[*pbVar15];
          iVar19 = iVar19 + uVar14;
          dst = dst + uVar14 * 4;
          pbVar15 = pbVar15 + uVar14;
          pAVar20 = pAVar20 + uVar14;
        } while (iVar19 < iVar8);
      }
      uVar14 = uVar9 + 1;
    } while ((int)uVar14 < iVar16);
  }
  return;
}

Assistant:

void av1_filter_block_plane_vert_opt(
    const AV1_COMMON *const cm, const MACROBLOCKD *const xd,
    const MACROBLOCKD_PLANE *const plane_ptr, const uint32_t mi_row,
    const uint32_t mi_col, AV1_DEBLOCKING_PARAMETERS *params_buf,
    TX_SIZE *tx_buf, int num_mis_in_lpf_unit_height_log2) {
  uint8_t *const dst_ptr = plane_ptr->dst.buf;
  const int dst_stride = plane_ptr->dst.stride;
  // Ensure that mi_cols/mi_rows are calculated based on frame dimension aligned
  // to MI_SIZE.
  const int plane_mi_cols =
      CEIL_POWER_OF_TWO(plane_ptr->dst.width, MI_SIZE_LOG2);
  const int plane_mi_rows =
      CEIL_POWER_OF_TWO(plane_ptr->dst.height, MI_SIZE_LOG2);
  // Whenever 'pipeline_lpf_mt_with_enc' is enabled, height of the unit to
  // filter (i.e., y_range) is calculated based on the size of the superblock
  // used.
  const int y_range = AOMMIN((int)(plane_mi_rows - mi_row),
                             (1 << num_mis_in_lpf_unit_height_log2));
  // Width of the unit to filter (i.e., x_range) should always be calculated
  // based on maximum superblock size as this function is called for mi_col = 0,
  // MAX_MIB_SIZE, 2 * MAX_MIB_SIZE etc.
  const int x_range = AOMMIN((int)(plane_mi_cols - mi_col), MAX_MIB_SIZE);
  const ptrdiff_t mode_step = 1;
  for (int y = 0; y < y_range; y++) {
    const uint32_t curr_y = mi_row + y;
    const uint32_t x_start = mi_col;
    const uint32_t x_end = mi_col + x_range;
    int min_block_height = block_size_high[BLOCK_128X128];
    set_lpf_parameters_for_line_luma(params_buf, tx_buf, cm, xd, VERT_EDGE,
                                     x_start, curr_y, plane_ptr, x_end,
                                     mode_step, &min_block_height);

    AV1_DEBLOCKING_PARAMETERS *params = params_buf;
    TX_SIZE *tx_size = tx_buf;
    USE_FILTER_TYPE use_filter_type = USE_SINGLE;

    uint8_t *p = dst_ptr + y * MI_SIZE * dst_stride;

    if ((y & 3) == 0 && (y + 3) < y_range && min_block_height >= 16) {
      // If we are on a row which is a multiple of 4, and the minimum height is
      // 16 pixels, then the current and right 3 cols must contain the same
      // prediction block. This is because dim 16 can only happen every unit of
      // 4 mi's.
      use_filter_type = USE_QUAD;
      y += 3;
    } else if ((y + 1) < y_range && min_block_height >= 8) {
      use_filter_type = USE_DUAL;
      y += 1;
    }

    for (int x = 0; x < x_range;) {
      if (*tx_size == TX_INVALID) {
        params->filter_length = 0;
        *tx_size = TX_4X4;
      }

      filter_vert(p, dst_stride, params, cm->seq_params, use_filter_type);

      // advance the destination pointer
      const uint32_t advance_units = tx_size_wide_unit[*tx_size];
      x += advance_units;
      p += advance_units * MI_SIZE;
      params += advance_units;
      tx_size += advance_units;
    }
  }
}